

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskController.cpp
# Opt level: O0

void __thiscall Storage::Disk::Controller::set_drive(Controller *this,int index_mask)

{
  int iVar1;
  int iVar2;
  Drive *pDVar3;
  reference this_00;
  pointer pDVar4;
  size_type local_20;
  size_t index;
  Preference former_preference;
  int index_mask_local;
  Controller *this_local;
  
  if (this->drive_selection_mask_ != index_mask) {
    iVar1 = (**(this->super_Source)._vptr_Source)();
    pDVar3 = get_drive(this);
    Drive::set_event_delegate(pDVar3,(EventDelegate *)0x0);
    if (index_mask == 0) {
      this->drive_ = &this->empty_drive_;
    }
    else {
      local_20 = 0;
      for (index._4_4_ = index_mask; (index._4_4_ & 1) == 0; index._4_4_ = (int)index._4_4_ >> 1) {
        local_20 = local_20 + 1;
      }
      this_00 = std::
                vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
                ::operator[](&this->drives_,local_20);
      pDVar4 = std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>::
               get(this_00);
      this->drive_ = pDVar4;
    }
    pDVar3 = get_drive(this);
    Drive::set_event_delegate(pDVar3,&this->super_EventDelegate);
    iVar2 = (**(this->super_Source)._vptr_Source)();
    if (iVar2 != iVar1) {
      ClockingHint::Source::update_clocking_observer(&this->super_Source);
    }
  }
  return;
}

Assistant:

void Controller::set_drive(int index_mask) {
	if(drive_selection_mask_ == index_mask) {
		return;
	}

	const ClockingHint::Preference former_preference = preferred_clocking();

	// Stop receiving events from the current drive.
	get_drive().set_event_delegate(nullptr);

	// TODO: a transfer of writing state, if writing?

	if(!index_mask) {
		drive_ = &empty_drive_;
	} else {
		// TEMPORARY FIX: connect up only the first selected drive.
		// TODO: at least merge events if multiple drives are selected. Some computers have
		// controllers that allow this, with usually meaningless results as far as I can
		// imagine. But the limit of an emulator shouldn't be the author's imagination.
		size_t index = 0;
		while(!(index_mask&1)) {
			index_mask >>= 1;
			++index;
		}
		drive_ = drives_[index].get();
	}

	get_drive().set_event_delegate(this);

	if(preferred_clocking() != former_preference) {
		update_clocking_observer();
	}
}